

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

bool __thiscall
Editor::textCommandEntered
          (Editor *this,string *input,int *currentLineNumber,LinkedList *list,bool *isInsert)

{
  command cVar1;
  int local_1e0;
  int local_1dc;
  int m;
  int n;
  string cmd;
  istringstream ss;
  bool *isInsert_local;
  LinkedList *list_local;
  int *currentLineNumber_local;
  string *input_local;
  Editor *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)((long)&cmd.field_2 + 8),input,8);
  std::__cxx11::string::string((string *)&m);
  local_1dc = 0;
  local_1e0 = 0;
  cVar1 = checkCommand(this,input);
  switch(cVar1) {
  case cmdL:
    cmdList(this,list);
    this_local._7_1_ = true;
    break;
  case cmdLn:
    std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)&m);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1dc);
    cmdList(this,local_1dc,list);
    this_local._7_1_ = true;
    break;
  case cmdLnm:
    std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)&m);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1dc);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1e0);
    cmdList(this,local_1dc,local_1e0,list);
    this_local._7_1_ = true;
    break;
  case cmdD:
    cmdDelete(this,currentLineNumber,list);
    this_local._7_1_ = true;
    break;
  case cmdDn:
    std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)&m);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1dc);
    cmdDelete(this,local_1dc,currentLineNumber,list);
    this_local._7_1_ = true;
    break;
  case cmdDnm:
    std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)&m);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1dc);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1e0);
    cmdDelete(this,local_1dc,local_1e0,currentLineNumber,list);
    this_local._7_1_ = true;
    break;
  case cmdI:
    cmdInsert(this,currentLineNumber,list,isInsert);
    this_local._7_1_ = true;
    break;
  case cmdIn:
    std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)&m);
    std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),&local_1dc);
    cmdInsert(this,local_1dc,currentLineNumber,list,isInsert);
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)&m);
  std::__cxx11::istringstream::~istringstream((istringstream *)(cmd.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool Editor::textCommandEntered(const std::string &input, int *currentLineNumber, LinkedList *list, bool *isInsert) {

    // Define string stream and variables to parse the command into it's letter and int value(s).
    // Adapted from: https://www.geeksforgeeks.org/split-a-sentence-into-words-in-cpp/
    std::istringstream ss(input);
    std::string cmd;
    int n = 0;
    int m = 0;

    // Check if the input is a command, parse the command, call the corresponding function.
    switch (checkCommand(input)) {
        case cmdL:

            // Call the List command
            cmdList(list);

            return true;

        case cmdLn:

            // Retrieve the command and the number(s) from the string stream
            ss >> cmd;
            ss >> n;

            // Call the corresponding function
            cmdList(n, list);

            return true;

        case cmdLnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdList(n, m, list);
            return true;
        case cmdD:
            cmdDelete(currentLineNumber, list);
            return true;
        case cmdDn:
            ss >> cmd;
            ss >> n;
            cmdDelete(n, currentLineNumber, list);
            return true;
        case cmdDnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdDelete(n, m, currentLineNumber, list);
            return true;
        case cmdI:
            cmdInsert(currentLineNumber, list, isInsert);
            return true;
        case cmdIn:
            ss >> cmd;
            ss >> n;
            cmdInsert(n, currentLineNumber, list, isInsert);
            return true;
        default:
            return false; // Input is not a valid command
    }
}